

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
visit(wasm::Expression*,wasm::IString_(void *this,Expression *curr,IString nextResult)

{
  Type *pTVar1;
  char **ppcVar2;
  undefined1 uVar3;
  Id IVar4;
  long lVar5;
  uintptr_t uVar6;
  ValueBuilder *pVVar7;
  pointer pSVar8;
  uint *puVar9;
  pointer ppEVar10;
  Value *curr_00;
  _Base_ptr p_Var11;
  Name name;
  Name name_00;
  JsSign JVar12;
  size_t sVar13;
  ValueBuilder *this_00;
  size_t sVar14;
  bool bVar15;
  Index IVar16;
  JsType JVar17;
  BasicType BVar18;
  Ref args_2;
  Name *__k;
  mapped_type *pmVar19;
  size_type sVar20;
  Function *pFVar21;
  Expression **ppEVar22;
  Ref RVar23;
  Ref RVar24;
  size_type sVar25;
  mapped_type *pmVar26;
  size_type sVar27;
  _Base_ptr p_Var28;
  Ref *pRVar29;
  NameScope scope;
  uint *puVar30;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  undefined8 *puVar31;
  pointer ppEVar32;
  _Base_ptr p_Var33;
  int shifts;
  Expression *pEVar34;
  wasm2js *pwVar35;
  Module *pMVar36;
  Type TVar37;
  Ref in_R8;
  Ref in_R9;
  size_t i;
  ulong index;
  size_t sVar38;
  pointer pSVar39;
  ValueBuilder *this_01;
  size_t sVar40;
  uint uVar41;
  IString target;
  IString op;
  IString name_01;
  IString name_02;
  IString name_03;
  IString name_04;
  IString target_00;
  IString target_01;
  IString target_02;
  IString target_03;
  IString label;
  IString name_05;
  Name name_06;
  IString name_07;
  IString name_08;
  IString op_00;
  IString target_04;
  IString name_09;
  IString name_10;
  IString op_01;
  IString op_02;
  IString name_11;
  IString name_12;
  IString target_05;
  IString target_06;
  IString target_07;
  IString target_08;
  IString target_09;
  IString op_03;
  IString target_10;
  IString nextResult_00;
  IString nextResult_01;
  IString nextResult_02;
  IString nextResult_03;
  IString key;
  IString nextResult_04;
  IString specific;
  IString nextResult_05;
  IString nextResult_06;
  IString nextResult_07;
  IString key_00;
  IString nextResult_08;
  IString nextResult_09;
  IString nextResult_10;
  IString nextResult_11;
  IString nextResult_12;
  IString nextResult_13;
  IString nextResult_14;
  IString nextResult_15;
  IString specific_00;
  IString nextResult_16;
  IString nextResult_17;
  IString nextResult_18;
  IString nextResult_19;
  IString specific_01;
  IString nextResult_20;
  IString nextResult_21;
  IString nextResult_22;
  IString op_04;
  IString key_01;
  IString nextResult_23;
  IString nextResult_24;
  IString op_05;
  IString key_02;
  IString nextResult_25;
  IString nextResult_26;
  IString nextResult_27;
  IString nextResult_28;
  IString op_06;
  IString specific_02;
  IString specific_03;
  IString nextResult_29;
  IString nextResult_30;
  IString op_07;
  IString nextResult_31;
  IString nextResult_32;
  IString nextResult_33;
  IString nextResult_34;
  IString specific_04;
  IString specific_05;
  IString nextResult_35;
  IString nextResult_36;
  IString nextResult_37;
  IString op_08;
  IString op_09;
  IString op_10;
  HeapAndPointer HVar42;
  string_view sVar43;
  IString IVar44;
  Expression EVar45;
  Name name_13;
  Ref args_3;
  IString old;
  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  targetIndexes;
  undefined1 auStack_d8 [8];
  anon_class_40_5_73e85241 stopFurtherFallthrough;
  undefined1 local_98 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> emittedTargets;
  Ref local_60;
  Ref theSwitch;
  Ref RStack_50;
  bool stoppedFurtherFallthrough;
  Ref local_48;
  undefined1 local_39;
  char cStack_38;
  undefined7 uStack_37;
  bool hoistedEndsWithUnreachable;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  
  IVar44.str._M_str = (Value *)nextResult.str._M_str;
  name_01.str._M_str = (char *)nextResult.str._M_len;
  args_3.inst = *(Value **)((long)this + 8);
  old.str._M_len = *(size_t *)((long)this + 0x10);
  *(char **)((long)this + 8) = name_01.str._M_str;
  *(Value **)((long)this + 0x10) = IVar44.str._M_str;
  sVar38 = DAT_00e64510;
  pMVar36 = WASM_MEMORY_GROW;
  if (curr == (Expression *)0x0) {
LAB_00761218:
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                  ,0x3a,
                  "ReturnType wasm::Visitor<ExpressionProcessor, cashew::Ref>::visit(Expression *) [SubType = ExpressionProcessor, ReturnType = cashew::Ref]"
                 );
  }
  _cStack_38 = (Ref *)this;
  switch(curr->_id) {
  case BlockId:
    old.str._M_str = (char *)curr;
    sVar20 = std::
             set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
             ::count((set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                      *)((long)this + 0x178),(key_type *)&old.str._M_str);
    if (sVar20 == 0) {
      IVar44.str._M_str = cashew::ValueBuilder::makeBlock();
      uVar6 = curr[2].type.id;
      for (sVar38 = 0; this = _cStack_38, uVar6 != sVar38; sVar38 = sVar38 + 1) {
        ppEVar22 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)(curr + 2),sVar38);
        nextResult_21.str._M_str = (char *)DAT_00e645e0;
        nextResult_21.str._M_len = (size_t)NO_RESULT;
        RVar23 = IString_(_cStack_38,*ppEVar22,nextResult_21);
        flattenAppend(IVar44.str._M_str,RVar23);
      }
      name_01.str._M_str = (char *)curr[1].type.id;
      if (name_01.str._M_str == (char *)0x0) break;
      RVar23.inst = (Value *)0x3;
      name_06.super_IString.str._M_str = name_01.str._M_str;
      name_06.super_IString.str._M_len = *(size_t *)(curr + 1);
      sVar43 = (string_view)fromName(wasm::Name,wasm::NameScope_(_cStack_38,name_06,Label);
      goto LAB_0076070c;
    }
    ppEVar22 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                         ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                          (curr + 2),0);
    pEVar34 = *ppEVar22;
    IVar44.str._M_str = DAT_00e645e0;
    name_01.str._M_str = NO_RESULT;
    goto LAB_007600c3;
  case IfId:
    nextResult_10.str._M_str = (char *)DAT_00e645f0;
    nextResult_10.str._M_len = EXPRESSION_RESULT;
    IVar44.str._M_str = IString_(this,*(Expression **)(curr + 1),nextResult_10);
    nextResult_11.str._M_str = (char *)DAT_00e645e0;
    nextResult_11.str._M_len = (size_t)NO_RESULT;
    RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_11);
    if (*(Expression **)(curr + 2) == (Expression *)0x0) {
      RVar24.inst = (Value *)0x0;
    }
    else {
      nextResult_12.str._M_str = (char *)DAT_00e645e0;
      nextResult_12.str._M_len = (size_t)NO_RESULT;
      RVar24 = IString_(this,*(Expression **)(curr + 2),nextResult_12);
    }
    IVar44.str._M_str = cashew::ValueBuilder::makeIf(IVar44.str._M_str,RVar23,RVar24);
    break;
  case LoopId:
    old.str._M_str = *(char **)(curr + 1);
    uVar6 = curr[1].type.id;
    targetIndexes._M_t._M_impl._0_4_ = SUB84(uVar6,0);
    targetIndexes._M_t._M_impl._4_4_ = SUB84(uVar6 >> 0x20,0);
    std::__detail::
    _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)((long)this + 0x1d8),(value_type *)&old.str._M_str);
    IVar44.str._M_str = *(Value **)(curr + 2);
    RVar23 = IString_(this,IVar44.str._M_str,(IString)*(string_view *)((long)this + 8));
    if (*(long *)(*(long *)(curr + 2) + 8) == 0) {
      RVar23 = blockify(cashew::Ref_(RVar23.inst,IVar44.str._M_str);
      name.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
      name.super_IString.str._M_len = (size_t)old.str._M_str;
      name.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
      IVar44 = fromName(wasm::Name,wasm::NameScope_(this,name,Label);
      label.str._M_str = IVar44.str._M_str;
      label.str._M_len = (size_t)label.str._M_str;
      IVar44.str._M_str = cashew::ValueBuilder::makeBreak((ValueBuilder *)IVar44.str._M_len,label);
      flattenAppend(RVar23,IVar44.str._M_str);
    }
    else if (*(long *)(*(long *)(curr + 2) + 8) != 1) {
      __assert_fail("curr->body->type == Type::none",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                    ,0x4c0,
                    "Ref wasm::Wasm2JSBuilder::processFunctionBody(Module *, Function *, bool)::ExpressionProcessor::visitLoop(Loop *)"
                   );
    }
    IVar44.str._M_str = cashew::ValueBuilder::makeDouble(1.0);
    IVar44.str._M_str = cashew::ValueBuilder::makeWhile(IVar44.str._M_str,RVar23);
    name_00.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
    name_00.super_IString.str._M_len = (size_t)old.str._M_str;
    name_00.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
    RVar23.inst = (Value *)0x3;
    sVar43 = (string_view)fromName(wasm::Name,wasm::NameScope_(this,name_00,Label);
LAB_0076070c:
    name_05.str._M_len = sVar43._M_str;
    name_05.str._M_str = (char *)IVar44.str._M_str;
    IVar44.str._M_str =
         cashew::ValueBuilder::makeLabel((ValueBuilder *)sVar43._M_len,name_05,RVar23);
    break;
  case BreakId:
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = curr[2].type.id;
    if (emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
      IVar44.str._M_str = makeBreakOrContinue(wasm::Name_(this,(Name)curr[1]);
      break;
    }
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(curr + 2);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&old.str._M_str;
    old.str._M_str = *(char **)curr;
    uVar6 = (curr->type).id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = curr[1]._id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
         *(undefined4 *)&curr[1].field_0x4;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)curr[1].type.id;
    targetIndexes._M_t._M_impl._0_4_ = SUB84(uVar6,0);
    targetIndexes._M_t._M_impl._4_4_ = SUB84(uVar6 >> 0x20,0);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pEVar34 = (Expression *)local_98;
    local_98._0_4_ = 2;
    emittedTargets._M_t._M_impl._0_8_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    goto LAB_007600c3;
  case SwitchId:
    nextResult_05.str._M_str = (char *)DAT_00e645f0;
    nextResult_05.str._M_len = EXPRESSION_RESULT;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)curr;
    IVar44.str._M_str = IString_(this,(Expression *)curr[4].type.id,nextResult_05);
    IVar44.str._M_str = makeJsCoercion(IVar44.str._M_str,JS_INT);
    IVar44.str._M_str = cashew::ValueBuilder::makeSwitch(IVar44.str._M_str);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&targetIndexes
    ;
    targetIndexes._M_t._M_impl._0_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_60 = IVar44.str._M_str;
    for (index = 0; index < curr[1].type.id; index = index + 1) {
      __k = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                      ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(curr + 1),index);
      pmVar19 = std::
                map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                              *)&old.str._M_str,__k);
      local_98._0_4_ = (int)index;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (pmVar19,(uint *)local_98);
    }
    pmVar26 = std::
              map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
              ::operator[]((map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
                            *)((long)this + 0x1a8),
                           (key_type *)
                           &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&emittedTargets;
    emittedTargets._M_t._M_impl._0_8_ = (ulong)(uint)emittedTargets._M_t._M_impl._4_4_ << 0x20;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_39 = 0;
    pSVar8 = (pmVar26->
             super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (pSVar39 = (pmVar26->
                   super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
                   )._M_impl.super__Vector_impl_data._M_start; pSVar39 != pSVar8;
        pSVar39 = pSVar39 + 1) {
      auStack_d8 = (undefined1  [8])(pSVar39->target).super_IString.str._M_len;
      stopFurtherFallthrough.stoppedFurtherFallthrough =
           (bool *)(pSVar39->target).super_IString.str._M_str;
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)local_98,(Name *)auStack_d8);
      if (stopFurtherFallthrough.stoppedFurtherFallthrough == (bool *)curr[3].type.id) {
        cashew::ValueBuilder::appendDefaultToSwitch(IVar44.str._M_str);
      }
      else {
        pmVar19 = std::
                  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&old.str._M_str,(key_type *)auStack_d8);
        puVar9 = (pmVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar30 = (pmVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start; puVar30 != puVar9;
            puVar30 = puVar30 + 1) {
          RVar23 = cashew::ValueBuilder::makeDouble((double)*puVar30);
          cashew::ValueBuilder::appendCaseToSwitch(IVar44.str._M_str,RVar23);
        }
      }
      ppEVar10 = (pSVar39->code).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      for (ppEVar32 = (pSVar39->code).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar32 != ppEVar10;
          ppEVar32 = ppEVar32 + 1) {
        curr_00 = (Value *)*ppEVar32;
        nextResult_20.str._M_str = (char *)DAT_00e645e0;
        nextResult_20.str._M_len = (size_t)NO_RESULT;
        RVar23.inst = curr_00;
        RVar24 = IString_(_cStack_38,(Expression *)curr_00,nextResult_20);
        RVar23 = blockify(cashew::Ref_(RVar24.inst,RVar23);
        cashew::ValueBuilder::appendCodeToSwitch(IVar44.str._M_str,RVar23,false);
        local_39 = (curr_00->field_1).str.str._M_len == 1;
      }
      this = _cStack_38;
    }
    auStack_d8 = (undefined1  [8])((long)&theSwitch.inst + 7);
    theSwitch.inst._7_1_ = 0;
    stopFurtherFallthrough.hoistedCases = (mapped_type *)&local_39;
    stopFurtherFallthrough.hoistedEndsWithUnreachable = (bool *)&local_60;
    stopFurtherFallthrough.stoppedFurtherFallthrough = (bool *)pmVar26;
    stopFurtherFallthrough.theSwitch = (Ref *)this;
    for (p_Var28 = targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        sVar38 = emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
        p_Var28 != (_Rb_tree_node_base *)&targetIndexes;
        p_Var28 = (_Base_ptr)std::_Rb_tree_increment(p_Var28)) {
      sVar27 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                         ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                          local_98,(key_type *)(p_Var28 + 1));
      if ((sVar27 == 0) &&
         (processFunctionBody::ExpressionProcessor::visitSwitch::anon_class_40_5_73e85241::
          operator()((anon_class_40_5_73e85241 *)auStack_d8),
         p_Var28[1]._M_parent !=
         *(_Base_ptr *)(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38))) {
        p_Var11 = p_Var28[1]._M_right;
        for (p_Var33 = p_Var28[1]._M_left; IVar44.str._M_str = local_60.inst, p_Var33 != p_Var11;
            p_Var33 = (_Base_ptr)&p_Var33->field_0x4) {
          RVar23 = cashew::ValueBuilder::makeDouble((double)p_Var33->_M_color);
          cashew::ValueBuilder::appendCaseToSwitch(IVar44.str._M_str,RVar23);
        }
        RVar23.inst = *(Value **)(p_Var28 + 1);
        RVar24 = makeBreakOrContinue(wasm::Name_(_cStack_38,(Name)*(string_view *)(p_Var28 + 1));
        RVar23 = blockify(cashew::Ref_(RVar24.inst,RVar23);
        cashew::ValueBuilder::appendCodeToSwitch(IVar44.str._M_str,RVar23,false);
      }
    }
    sVar27 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                       ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                        local_98,(key_type *)
                                 (emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                 0x30));
    if (sVar27 == 0) {
      processFunctionBody::ExpressionProcessor::visitSwitch::anon_class_40_5_73e85241::operator()
                ((anon_class_40_5_73e85241 *)auStack_d8);
      cashew::ValueBuilder::appendDefaultToSwitch(local_60);
      RVar23.inst = local_60.inst;
      IVar44.str._M_str = *(Value **)&((IString *)(sVar38 + 0x30))->str;
      RVar24 = makeBreakOrContinue(wasm::Name_(_cStack_38,(Name)((IString *)(sVar38 + 0x30))->str);
      IVar44.str._M_str = blockify(cashew::Ref_(RVar24.inst,IVar44.str._M_str);
      cashew::ValueBuilder::appendCodeToSwitch(RVar23,IVar44.str._M_str,false);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_98);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)&old.str._M_str);
    this = _cStack_38;
    IVar44.str._M_str = local_60.inst;
    break;
  case CallId:
    if ((char)curr[4]._id == BlockId) {
      ppcVar2 = &old.str._M_str;
      Fatal::Fatal((Fatal *)ppcVar2);
      Fatal::operator<<((Fatal *)ppcVar2,(char (*) [40])"tail calls not yet supported in wasm2js");
      goto LAB_00761442;
    }
    IVar44 = fromName(wasm::Name,wasm::NameScope_(this,(Name)curr[3],Top);
    target_01.str._M_str = IVar44.str._M_str;
    target_01.str._M_len = (size_t)target_01.str._M_str;
    local_98 = (undefined1  [8])
               cashew::ValueBuilder::makeCall((ValueBuilder *)IVar44.str._M_len,target_01);
    _cStack_38 = (Ref *)CONCAT71(uStack_37,1);
    if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
      pFVar21 = Module::getFunction(*(Module **)((long)this + 0x20),(Name)curr[3]);
      _cStack_38 = (Ref *)CONCAT71(uStack_37,
                                   (pFVar21->super_Importable).module.super_IString.str._M_str !=
                                   (char *)0x0);
    }
    uVar6 = curr[1].type.id;
    targetIndexes._M_t._M_impl._0_8_ = 0;
    old.str._M_str = (char *)(curr + 1);
    while ((targetIndexes._M_t._M_impl._0_8_ != uVar6 || ((Expression *)old.str._M_str != curr + 1))
          ) {
      ppEVar22 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&old.str._M_str);
      pEVar34 = *ppEVar22;
      nextResult_15.str._M_str = (char *)DAT_00e645f0;
      nextResult_15.str._M_len = EXPRESSION_RESULT;
      IVar44.str._M_str = IString_(this,pEVar34,nextResult_15);
      if (cStack_38 != '\0') {
        JVar17 = wasmToJsType((Type)(pEVar34->type).id);
        IVar44.str._M_str = makeJsCoercion(IVar44.str._M_str,JVar17);
      }
      pRVar29 = cashew::Ref::operator[]((Ref *)local_98,2);
      cashew::Value::push_back(pRVar29->inst,IVar44.str._M_str);
      targetIndexes._M_t._M_impl._0_8_ = targetIndexes._M_t._M_impl._0_8_ + 1;
    }
    IVar44.str._M_str = (Value *)local_98;
    if (cStack_38 == '\0') break;
    TVar37.id = (curr->type).id;
    goto LAB_00760aff;
  case CallIndirectId:
    IVar44.str._M_str = visitCallIndirect(wasm::CallIndirect__(this,(CallIndirect *)curr);
    break;
  case LocalGetId:
    sVar43 = (string_view)
             Function::getLocalNameOrGeneric(*(Function **)((long)this + 0x18),curr[1]._id);
    scope = Local;
    goto LAB_00760009;
  case LocalSetId:
    pEVar34 = (Expression *)curr[1].type.id;
    EVar45 = (Expression)
             Function::getLocalNameOrGeneric(*(Function **)((long)this + 0x18),curr[1]._id);
    name_01.str._M_str = (char *)0x2;
    goto LAB_00760399;
  case GlobalGetId:
    sVar43 = *(string_view *)(curr + 1);
    scope = Top;
LAB_00760009:
    IVar44 = fromName(wasm::Name,wasm::NameScope_(this,sVar43,scope);
    name_04.str._M_str = IVar44.str._M_str;
    name_04.str._M_len = (size_t)name_04.str._M_str;
    IVar44.str._M_str = cashew::ValueBuilder::makeName((ValueBuilder *)IVar44.str._M_len,name_04);
    break;
  case GlobalSetId:
    pEVar34 = *(Expression **)(curr + 2);
    EVar45 = curr[1];
    name_01.str._M_str = (char *)0x1;
LAB_00760399:
    name_13.super_IString.str._M_len = EVar45.type.id;
    name_13.super_IString.str._M_str = name_01.str._M_str;
    IVar44.str._M_str =
         makeSetVar(wasm::Expression*,wasm::Expression*,wasm::Name,wasm::NameScope_
                   (this,pEVar34,EVar45._0_8_,name_13,(NameScope)in_R9.inst);
    break;
  case LoadId:
    if ((*(ulong *)(curr + 2) != 0) && (*(ulong *)(curr + 2) != (ulong)(byte)(char)curr[1]._id)) {
      __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                    ,0x5a8,
                    "Ref wasm::Wasm2JSBuilder::processFunctionBody(Module *, Function *, bool)::ExpressionProcessor::visitLoad(Load *)"
                   );
    }
    IVar44.str._M_str =
         makePointer(wasm::Expression*,wasm::Address_
                   (this,*(Expression **)(curr + 3),(Address)curr[1].type.id);
    pTVar1 = &curr->type;
    BVar18 = wasm::Type::getBasic(pTVar1);
    if (BVar18 == f64) {
      name_07.str._M_str = extraout_RDX_00;
      name_07.str._M_len = DAT_00e64b40;
      RVar23 = cashew::ValueBuilder::makeName(cashew::HEAPF64,name_07);
      shifts = 3;
    }
    else {
      if (BVar18 == f32) {
        puVar31 = &cashew::HEAPF32;
      }
      else {
        if (BVar18 != i32) {
          Fatal::Fatal((Fatal *)&old.str._M_str);
          std::operator<<((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                          "Unhandled type in load: ");
          Fatal::operator<<((Fatal *)&old.str._M_str,pTVar1);
          goto LAB_00761442;
        }
        uVar3 = (undefined1)curr[1]._id;
        if (uVar3 != BreakId) {
          if (uVar3 == IfId) {
            bVar15 = LoadUtils::isSignRelevant((Load *)curr);
            if ((bVar15) && (*(byte *)((long)&curr[1]._id + 1) != 0)) {
              puVar31 = &cashew::HEAP16;
            }
            else {
              puVar31 = &cashew::HEAPU16;
            }
            name_11.str._M_str = extraout_RDX_05;
            name_11.str._M_len = puVar31[1];
            RVar23 = cashew::ValueBuilder::makeName((ValueBuilder *)*puVar31,name_11);
            shifts = 1;
          }
          else {
            if (uVar3 != BlockId) {
              Fatal::Fatal((Fatal *)&old.str._M_str);
              std::operator<<((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                              "Unhandled number of bytes in i32 load: ");
              Fatal::operator<<((Fatal *)&old.str._M_str,(uchar *)(curr + 1));
              goto LAB_00761442;
            }
            bVar15 = LoadUtils::isSignRelevant((Load *)curr);
            if ((bVar15) && (*(byte *)((long)&curr[1]._id + 1) != 0)) {
              puVar31 = &cashew::HEAP8;
            }
            else {
              puVar31 = &cashew::HEAPU8;
            }
            name_12.str._M_str = extraout_RDX_01;
            name_12.str._M_len = puVar31[1];
            RVar23 = cashew::ValueBuilder::makeName((ValueBuilder *)*puVar31,name_12);
            shifts = 0;
          }
          goto LAB_00760a5d;
        }
        puVar31 = &cashew::HEAP32;
      }
      name_09.str._M_str = extraout_RDX_00;
      name_09.str._M_len = puVar31[1];
      RVar23 = cashew::ValueBuilder::makeName((ValueBuilder *)*puVar31,name_09);
      shifts = 2;
    }
LAB_00760a5d:
    IVar44.str._M_str = cashew::ValueBuilder::makePtrShift(IVar44.str._M_str,shifts);
    IVar44.str._M_str = cashew::ValueBuilder::makeSub(RVar23,IVar44.str._M_str);
    if ((char)curr[2].type.id == '\x01') {
      name_10.str._M_str = extraout_RDX_06;
      name_10.str._M_len = DAT_00e64c80;
      old.str._M_str = (char *)IVar44.str._M_str;
      IVar44.str._M_str = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_10);
      key_02.str._M_str = (char *)&cashew::LOAD;
      key_02.str._M_len = DAT_00e64ca0;
      IVar44.str._M_str = cashew::ValueBuilder::makeDot(IVar44.str._M_str,cashew::LOAD,key_02);
      IVar44.str._M_str = cashew::ValueBuilder::makeCall(IVar44.str._M_str);
      ppcVar2 = &old.str._M_str;
      pRVar29 = cashew::Ref::operator[]((Ref *)ppcVar2,1);
      cashew::ValueBuilder::appendToCall(IVar44.str._M_str,pRVar29->inst);
      pRVar29 = cashew::Ref::operator[]((Ref *)ppcVar2,2);
      cashew::ValueBuilder::appendToCall(IVar44.str._M_str,pRVar29->inst);
    }
    if ((*(int *)(*this + 100) != 0) && ((*(byte *)((long)this + 0x28) & 1) == 0)) break;
    TVar37.id = pTVar1->id;
    old.str._M_str = (char *)IVar44.str._M_str;
LAB_00760aff:
    JVar17 = wasmToJsType(TVar37);
    goto LAB_00760dd1;
  case StoreId:
    IVar44.str._M_str = visitStore(wasm::Store__(this,(Store *)curr);
    break;
  case ConstId:
    IVar44.str._M_str =
         visitConst(wasm::Const__(curr,(Const *)&switchD_0075f9eb::switchdataD_00b770c0);
    break;
  case UnaryId:
    local_98 = (undefined1  [8])curr;
    BVar18 = wasm::Type::getBasic(&curr->type);
    sVar14 = DAT_00e64a00;
    this_00 = cashew::B_NOT;
    sVar40 = DAT_00e649f0;
    this_01 = cashew::L_NOT;
    sVar13 = DAT_00e649b0;
    pVVar7 = cashew::MINUS;
    sVar38 = DAT_00e64410;
    pMVar36 = MATH_CLZ32;
    if (1 < BVar18 - f32) {
      if (BVar18 != i32) {
        Fatal::Fatal((Fatal *)&old.str._M_str);
        std::operator<<((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                        "Unhandled type in unary: ");
        Fatal::operator<<((Fatal *)&old.str._M_str,(Unary **)local_98);
        goto LAB_00761442;
      }
      IVar4 = curr[1]._id;
      IVar44.str._M_str = DAT_00e645f0;
      if (IVar4 - MemorySizeId < 0xe) {
        specific_04.str._M_str =
             (char *)((long)&switchD_00760986::switchdataD_00b77434 +
                     (long)(int)(&switchD_00760986::switchdataD_00b77434)[IVar4 - MemorySizeId]);
        switch(IVar4) {
        case MemorySizeId:
          nextResult_36.str._M_str = (char *)DAT_00e645f0;
          nextResult_36.str._M_len = EXPRESSION_RESULT;
          RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_36);
          break;
        default:
          goto switchD_007607ff_caseD_31;
        case AtomicCmpxchgId:
        case SIMDExtractId:
          goto switchD_007607ff_caseD_34;
        case AtomicNotifyId:
        case SIMDShuffleId:
          goto switchD_007607ff_caseD_35;
        case SIMDShiftId:
          specific_04.str._M_len = DAT_00e64630;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_F32,specific_04);
          specific_05.str._M_str = specific_04.str._M_str;
          specific_05.str._M_len = DAT_00e64600;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_I32,specific_05);
          sVar38 = DAT_00e64630;
          pMVar36 = ABI::wasm2js::SCRATCH_STORE_F32;
          nextResult_35.str._M_str = (char *)DAT_00e645f0;
          nextResult_35.str._M_len = EXPRESSION_RESULT;
          IVar44.str._M_str = DAT_00e645f0;
          RVar23 = IString_(_cStack_38,(Expression *)curr[1].type.id,nextResult_35);
          target_08.str._M_str = (char *)RVar23.inst;
          target_08.str._M_len = sVar38;
          RVar23 = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)pMVar36,target_08,IVar44.str._M_str);
          this = _cStack_38;
          sVar38 = DAT_00e64600;
          pMVar36 = ABI::wasm2js::SCRATCH_LOAD_I32;
          RVar24 = cashew::ValueBuilder::makeDouble(2.0);
          target_09.str._M_str = (char *)RVar24.inst;
          target_09.str._M_len = sVar38;
          IVar44.str._M_str =
               cashew::ValueBuilder::makeCall<cashew::Ref>
                         ((ValueBuilder *)pMVar36,target_09,IVar44.str._M_str);
          goto LAB_00760eb8;
        }
LAB_00760ef0:
        op_03.str._M_str = (char *)RVar23.inst;
        op_03.str._M_len = sVar40;
        IVar44.str._M_str = cashew::ValueBuilder::makeUnary(this_01,op_03,IVar44.str._M_str);
        break;
      }
      switch(IVar4) {
      case TableSizeId:
        nextResult_22.str._M_str = (char *)DAT_00e645f0;
        nextResult_22.str._M_len = EXPRESSION_RESULT;
        RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_22);
        sVar38 = DAT_00e64ab0;
        IVar44.str._M_str = cashew::LSHIFT.inst;
        RVar24 = cashew::ValueBuilder::makeDouble(24.0);
        op_04.str._M_str = (char *)RVar24.inst;
        op_04.str._M_len = sVar38;
        IVar44.str._M_str =
             cashew::ValueBuilder::makeBinary(RVar23.inst,IVar44.str._M_str,op_04,in_R8);
        uVar41 = 0x40380000;
        sVar38 = DAT_00e64aa0;
        RVar24.inst = cashew::RSHIFT;
        break;
      case TableGrowId:
        nextResult_37.str._M_str = (char *)DAT_00e645f0;
        nextResult_37.str._M_len = EXPRESSION_RESULT;
        RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_37);
        sVar38 = DAT_00e64ab0;
        IVar44.str._M_str = cashew::LSHIFT.inst;
        RVar24 = cashew::ValueBuilder::makeDouble(16.0);
        op_08.str._M_str = (char *)RVar24.inst;
        op_08.str._M_len = sVar38;
        IVar44.str._M_str =
             cashew::ValueBuilder::makeBinary(RVar23.inst,IVar44.str._M_str,op_08,in_R8);
        uVar41 = 0x40300000;
        sVar38 = DAT_00e64aa0;
        RVar24.inst = cashew::RSHIFT;
        break;
      case TryId:
      case ThrowId:
      case RethrowId:
switchD_007607ff_caseD_31:
        handle_unreachable("unhandled unary",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                           ,0x6b1);
      case TupleMakeId:
      case I31NewId:
switchD_007607ff_caseD_34:
        nextResult_24.str._M_str = (char *)DAT_00e645f0;
        nextResult_24.str._M_len = EXPRESSION_RESULT;
        RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_24);
        op_00.str._M_str = (char *)RVar23.inst;
        op_00.str._M_len = sVar14;
        RVar23 = cashew::ValueBuilder::makeUnary(this_00,op_00,IVar44.str._M_str);
        this_01 = this_00;
        sVar40 = sVar14;
        goto LAB_00760ef0;
      case TupleExtractId:
      case I31GetId:
switchD_007607ff_caseD_35:
        nextResult_25.str._M_str = (char *)DAT_00e645f0;
        nextResult_25.str._M_len = EXPRESSION_RESULT;
        RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_25);
        op_01.str._M_str = (char *)RVar23.inst;
        op_01.str._M_len = sVar14;
        RVar23 = cashew::ValueBuilder::makeUnary(this_00,op_01,IVar44.str._M_str);
        op_02.str._M_str = (char *)RVar23.inst;
        op_02.str._M_len = sVar14;
        IVar44.str._M_str = cashew::ValueBuilder::makeUnary(this_00,op_02,IVar44.str._M_str);
        uVar41 = 0;
        sVar38 = DAT_00e64ac0;
        RVar24.inst = cashew::TRSHIFT.inst;
        break;
      default:
        if (IVar4 != InvalidId) {
          if ((IVar4 == IfId) || (IVar4 == BreakId)) {
            handle_unreachable("i32 unary should have been removed",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                               ,0x671);
          }
          goto switchD_007607ff_caseD_31;
        }
        nextResult_34.str._M_str = (char *)DAT_00e645f0;
        nextResult_34.str._M_len = EXPRESSION_RESULT;
        RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_34);
        goto LAB_00760138;
      }
      RVar23 = cashew::ValueBuilder::makeDouble((double)((ulong)uVar41 << 0x20));
      goto LAB_00761206;
    }
    switch(curr[1]._id) {
    case CallId:
    case CallIndirectId:
      nextResult_03.str._M_str = (char *)DAT_00e645f0;
      nextResult_03.str._M_len = EXPRESSION_RESULT;
      IVar44.str._M_str = DAT_00e645f0;
      RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_03);
      op.str._M_str = (char *)RVar23.inst;
      op.str._M_len = sVar13;
      IVar44.str._M_str = cashew::ValueBuilder::makeUnary(pVVar7,op,IVar44.str._M_str);
      goto LAB_00760c11;
    case LocalGetId:
    case LocalSetId:
      puVar31 = &MATH_ABS;
      break;
    case GlobalGetId:
    case GlobalSetId:
      puVar31 = &MATH_CEIL;
      break;
    case LoadId:
    case StoreId:
      puVar31 = &MATH_FLOOR;
      break;
    case ConstId:
    case UnaryId:
      puVar31 = &MATH_TRUNC;
      break;
    case BinaryId:
    case SelectId:
      handle_unreachable("operation should have been removed in previous passes",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x707);
    case DropId:
    case ReturnId:
      puVar31 = &MATH_SQRT;
      break;
    default:
      handle_unreachable("unhandled unary float operator",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x70a);
    case SIMDLoadStoreLaneId:
      nextResult_33.str._M_str = (char *)DAT_00e645f0;
      nextResult_33.str._M_len = EXPRESSION_RESULT;
      IVar44.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_33);
      IVar44.str._M_str = makeJsCoercion(IVar44.str._M_str,JS_INT);
      goto LAB_00760dcb;
    case MemoryInitId:
      nextResult_31.str._M_str = (char *)DAT_00e645f0;
      nextResult_31.str._M_len = EXPRESSION_RESULT;
      IVar44.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_31);
      IVar44.str._M_str = makeJsCoercion(IVar44.str._M_str,JS_INT);
      goto LAB_00760d87;
    case DataDropId:
      nextResult_28.str._M_str = (char *)DAT_00e645f0;
      nextResult_28.str._M_len = EXPRESSION_RESULT;
      RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_28);
      sVar38 = DAT_00e64ac0;
      IVar44.str._M_str = cashew::TRSHIFT.inst;
      RVar24 = cashew::ValueBuilder::makeDouble(0.0);
      op_06.str._M_str = (char *)RVar24.inst;
      op_06.str._M_len = sVar38;
      IVar44.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar23.inst,IVar44.str._M_str,op_06,in_R8);
      goto LAB_00760dcb;
    case MemoryCopyId:
      nextResult_30.str._M_str = (char *)DAT_00e645f0;
      nextResult_30.str._M_len = EXPRESSION_RESULT;
      RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_30);
      sVar38 = DAT_00e64ac0;
      IVar44.str._M_str = cashew::TRSHIFT.inst;
      RVar24 = cashew::ValueBuilder::makeDouble(0.0);
      op_07.str._M_str = (char *)RVar24.inst;
      op_07.str._M_len = sVar38;
      IVar44.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar23.inst,IVar44.str._M_str,op_07,in_R8);
      goto LAB_00760d87;
    case RefFuncId:
      nextResult_27.str._M_str = (char *)DAT_00e645f0;
      nextResult_27.str._M_len = EXPRESSION_RESULT;
      IVar44.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_27);
LAB_00760d87:
      JVar17 = JS_DOUBLE;
      goto LAB_00760dcd;
    case RefEqId:
      nextResult_32.str._M_str = (char *)DAT_00e645f0;
      nextResult_32.str._M_len = EXPRESSION_RESULT;
      IVar44.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_32);
LAB_00760dcb:
      JVar17 = JS_FLOAT;
LAB_00760dcd:
      goto LAB_00760dd1;
    case TableGetId:
      specific_02.str._M_str = (char *)&switchD_0075fb07::switchdataD_00b77394;
      specific_02.str._M_len = DAT_00e64610;
      puVar30 = &switchD_0075fb07::switchdataD_00b77394;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_I32,specific_02);
      specific_03.str._M_str = (char *)puVar30;
      specific_03.str._M_len = DAT_00e64620;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_F32,specific_03);
      sVar38 = DAT_00e64610;
      pMVar36 = ABI::wasm2js::SCRATCH_STORE_I32;
      IVar44.str._M_str = cashew::ValueBuilder::makeDouble(2.0);
      nextResult_29.str._M_str = (char *)DAT_00e645f0;
      nextResult_29.str._M_len = EXPRESSION_RESULT;
      RVar23 = IString_(_cStack_38,(Expression *)curr[1].type.id,nextResult_29);
      target_06.str._M_str = (char *)IVar44.str._M_str;
      target_06.str._M_len = sVar38;
      RVar23 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                         ((ValueBuilder *)pMVar36,target_06,RVar23,in_R8);
      this = _cStack_38;
      target_07.str._M_str = extraout_RDX_07;
      target_07.str._M_len = DAT_00e64620;
      IVar44.str._M_str =
           cashew::ValueBuilder::makeCall((ValueBuilder *)ABI::wasm2js::SCRATCH_LOAD_F32,target_07);
LAB_00760eb8:
      IVar44.str._M_str = cashew::ValueBuilder::makeSeq(RVar23,IVar44.str._M_str);
      goto LAB_00760dd9;
    }
    pVVar7 = (ValueBuilder *)*puVar31;
    sVar38 = puVar31[1];
    nextResult_26.str._M_str = (char *)DAT_00e645f0;
    nextResult_26.str._M_len = EXPRESSION_RESULT;
    IVar44.str._M_str = DAT_00e645f0;
    RVar23 = IString_(this,(Expression *)curr[1].type.id,nextResult_26);
    target_05.str._M_str = (char *)RVar23.inst;
    target_05.str._M_len = sVar38;
    IVar44.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar7,target_05,IVar44.str._M_str);
LAB_00760c11:
    if ((curr->type).id != 4) break;
    JVar17 = JS_FLOAT;
    goto LAB_00760dd1;
  case BinaryId:
    nextResult_08.str._M_str = (char *)DAT_00e645f0;
    nextResult_08.str._M_len = EXPRESSION_RESULT;
    local_98 = (undefined1  [8])curr;
    IVar44.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_08);
    this = _cStack_38;
    nextResult_09.str._M_str = (char *)DAT_00e645f0;
    nextResult_09.str._M_len = EXPRESSION_RESULT;
    RVar23 = IString_(_cStack_38,*(Expression **)(curr + 2),nextResult_09);
    pTVar1 = &curr->type;
    BVar18 = wasm::Type::getBasic(pTVar1);
    if (BVar18 - f32 < 2) {
      switch(curr[1]._id) {
      case ThrowId:
      case ArrayNewId:
        puVar31 = &cashew::PLUS;
        break;
      case RethrowId:
      case ArrayNewSegId:
        puVar31 = &cashew::MINUS;
        break;
      case TupleMakeId:
      case ArrayNewFixedId:
        puVar31 = &cashew::MUL;
        break;
      case TupleExtractId:
      case ArrayGetId:
        puVar31 = &cashew::DIV;
        break;
      default:
        ppcVar2 = &old.str._M_str;
        Fatal::Fatal((Fatal *)ppcVar2);
        Fatal::operator<<((Fatal *)ppcVar2,(char (*) [34])"Unhandled binary float operator: ");
        goto LAB_00761442;
      case I31GetId:
      case ArrayLenId:
        puVar31 = &MATH_MIN;
        goto LAB_00760a03;
      case CallRefId:
      case ArrayCopyId:
        puVar31 = &MATH_MAX;
LAB_00760a03:
        target_04.str._M_str = (char *)IVar44.str._M_str;
        target_04.str._M_len = puVar31[1];
        IVar44.str._M_str =
             cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                       ((ValueBuilder *)*puVar31,target_04,RVar23,in_R8);
        goto LAB_00760c11;
      }
      op_05.str._M_str = (char *)RVar23.inst;
      op_05.str._M_len = puVar31[1];
      IVar44.str._M_str =
           cashew::ValueBuilder::makeBinary(IVar44.str._M_str,(Value *)*puVar31,op_05,in_R8);
      goto LAB_00760c11;
    }
    if (BVar18 != i32) {
      Fatal::Fatal((Fatal *)&old.str._M_str);
      std::operator<<((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                      "Unhandled type in binary: ");
      Fatal::operator<<((Fatal *)&old.str._M_str,(Binary **)local_98);
LAB_00761442:
      Fatal::~Fatal((Fatal *)&old.str._M_str);
    }
    switch(curr[1]._id) {
    case InvalidId:
      puVar31 = &cashew::PLUS;
      break;
    case BlockId:
      puVar31 = &cashew::MINUS;
      break;
    case IfId:
      if (pTVar1->id == 2) {
        target_10.str._M_str = (char *)IVar44.str._M_str;
        target_10.str._M_len = DAT_00e643e0;
        IVar44.str._M_str =
             cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                       (MATH_IMUL,target_10,RVar23,in_R8);
        goto LAB_00760dd9;
      }
      puVar31 = &cashew::MUL;
      goto LAB_007611f9;
    case LoopId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_SIGNED);
      puVar31 = &cashew::DIV;
      goto LAB_0076113d;
    case BreakId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_UNSIGNED);
      puVar31 = &cashew::DIV;
      goto LAB_007610de;
    case SwitchId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_SIGNED);
      puVar31 = &cashew::MOD;
LAB_0076113d:
      RVar24.inst = (Value *)*puVar31;
      sVar38 = puVar31[1];
      JVar12 = JS_SIGNED;
LAB_00761149:
      RVar23 = makeSigning(RVar23,JVar12);
      goto LAB_00761172;
    case CallId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_UNSIGNED);
      puVar31 = &cashew::MOD;
LAB_007610de:
      RVar24.inst = (Value *)*puVar31;
      sVar38 = puVar31[1];
      JVar12 = JS_UNSIGNED;
      goto LAB_00761149;
    case CallIndirectId:
      puVar31 = &cashew::AND;
      break;
    case LocalGetId:
      puVar31 = &cashew::OR;
      break;
    case LocalSetId:
      puVar31 = &cashew::XOR;
      break;
    case GlobalGetId:
      puVar31 = &cashew::LSHIFT.inst;
      break;
    case GlobalSetId:
      puVar31 = &cashew::RSHIFT;
      break;
    case LoadId:
      puVar31 = &cashew::TRSHIFT.inst;
      break;
    case StoreId:
    case ConstId:
      handle_unreachable("should be removed already",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x791);
    case UnaryId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_SIGNED);
      puVar31 = &cashew::EQ;
      goto LAB_007611d2;
    case BinaryId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_SIGNED);
      puVar31 = &cashew::NE;
      goto LAB_007611d2;
    case SelectId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_SIGNED);
      puVar31 = &cashew::LT;
      goto LAB_007611d2;
    case DropId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_UNSIGNED);
      puVar31 = &cashew::LT;
      goto LAB_007611af;
    case ReturnId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_SIGNED);
      puVar31 = &cashew::LE;
      goto LAB_007611d2;
    case MemorySizeId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_UNSIGNED);
      puVar31 = &cashew::LE;
      goto LAB_007611af;
    case MemoryGrowId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_SIGNED);
      puVar31 = &cashew::GT;
      goto LAB_007611d2;
    case NopId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_UNSIGNED);
      puVar31 = &cashew::GT;
      goto LAB_007611af;
    case UnreachableId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_SIGNED);
      puVar31 = &cashew::GE;
LAB_007611d2:
      RVar24.inst = (Value *)*puVar31;
      sVar38 = puVar31[1];
      JVar12 = JS_SIGNED;
LAB_007611de:
      RVar23 = makeSigning(RVar23,JVar12);
      goto LAB_00761206;
    case AtomicRMWId:
      IVar44.str._M_str = makeSigning(IVar44.str._M_str,JS_UNSIGNED);
      puVar31 = &cashew::GE;
LAB_007611af:
      RVar24.inst = (Value *)*puVar31;
      sVar38 = puVar31[1];
      JVar12 = JS_UNSIGNED;
      goto LAB_007611de;
    default:
      handle_unreachable("unhandled i32 binary operator",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x793);
    case RefTestId:
    case ArrayFillId:
      puVar31 = &cashew::EQ;
      goto LAB_007611f9;
    case RefCastId:
    case ArrayInitId:
      puVar31 = &cashew::NE;
      goto LAB_007611f9;
    case BrOnId:
    case RefAsId:
      puVar31 = &cashew::LT;
      goto LAB_007611f9;
    case StructNewId:
    case StringNewId:
      puVar31 = &cashew::LE;
      goto LAB_007611f9;
    case StructGetId:
    case StringConstId:
      puVar31 = &cashew::GT;
      goto LAB_007611f9;
    case StructSetId:
    case StringMeasureId:
      puVar31 = &cashew::GE;
LAB_007611f9:
      RVar24.inst = (Value *)*puVar31;
      sVar38 = puVar31[1];
LAB_00761206:
      op_10.str._M_str = (char *)RVar23.inst;
      op_10.str._M_len = sVar38;
      IVar44.str._M_str = cashew::ValueBuilder::makeBinary(IVar44.str._M_str,RVar24,op_10,in_R8);
      goto LAB_00760dd9;
    }
    RVar24.inst = (Value *)*puVar31;
    sVar38 = puVar31[1];
LAB_00761172:
    op_09.str._M_str = (char *)RVar23.inst;
    op_09.str._M_len = sVar38;
    IVar44.str._M_str = cashew::ValueBuilder::makeBinary(IVar44.str._M_str,RVar24,op_09,in_R8);
    TVar37.id = pTVar1->id;
LAB_0075fe32:
    JVar17 = wasmToJsType(TVar37);
LAB_00760dd1:
    IVar44.str._M_str = makeJsCoercion(IVar44.str._M_str,JVar17);
    break;
  case SelectId:
    IVar44.str._M_str = visitSelect(wasm::Select__(this,(Select *)curr);
    break;
  case DropId:
    pEVar34 = *(Expression **)(curr + 1);
    IVar44.str._M_str = DAT_00e645e0;
    name_01.str._M_str = NO_RESULT;
LAB_007600c3:
    nextResult_13.str._M_str = (char *)IVar44.str._M_str;
    nextResult_13.str._M_len = (size_t)name_01.str._M_str;
    IVar44.str._M_str = IString_(this,pEVar34,nextResult_13);
    break;
  case ReturnId:
    if (*(Expression **)(curr + 1) == (Expression *)0x0) {
      IVar44.str._M_str = (Value *)0x0;
    }
    else {
      nextResult_19.str._M_str = (char *)DAT_00e645f0;
      nextResult_19.str._M_len = EXPRESSION_RESULT;
      IVar44.str._M_str = IString_(this,*(Expression **)(curr + 1),nextResult_19);
      if (((*(int *)(*this + 100) == 0) || (*(char *)((long)this + 0x28) != '\0')) ||
         (sVar25 = std::
                   _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)(*this + 0x330),*(key_type **)((long)this + 0x18)), sVar25 != 0)) {
        JVar17 = wasmToJsType((Type)*(uintptr_t *)(*(long *)(curr + 1) + 8));
        IVar44.str._M_str = makeJsCoercion(IVar44.str._M_str,JVar17);
      }
    }
    IVar44.str._M_str = cashew::ValueBuilder::makeReturn(IVar44.str._M_str);
    break;
  case MemorySizeId:
    sVar38 = DAT_00e64520;
    pMVar36 = WASM_MEMORY_SIZE;
    goto LAB_007603d5;
  case MemoryGrowId:
    pwVar35 = *(wasm2js **)((long)this + 0x20);
    if ((*(long **)(pwVar35 + 0x78) == *(long **)(pwVar35 + 0x80)) ||
       (lVar5 = **(long **)(pwVar35 + 0x78), IVar44.str._M_str = *(Value **)(lVar5 + 0x40),
       IVar44.str._M_str <= *(Value **)(lVar5 + 0x38))) goto LAB_007603a7;
    nextResult_14.str._M_str = (char *)DAT_00e645f0;
    nextResult_14.str._M_len = EXPRESSION_RESULT;
    IVar44.str._M_str = DAT_00e645f0;
    RVar23 = IString_(this,*(Expression **)(curr + 1),nextResult_14);
    JVar17 = wasmToJsType((Type)*(uintptr_t *)(*(long *)(curr + 1) + 8));
    RVar23 = makeJsCoercion(RVar23,JVar17);
    goto LAB_00760138;
  case NopId:
  case AtomicFenceId:
    IVar44.str._M_str = cashew::ValueBuilder::makeToplevel();
    break;
  case UnreachableId:
    pwVar35 = *(wasm2js **)((long)this + 0x20);
LAB_007603a7:
    specific_01.str._M_str = (char *)IVar44.str._M_str;
    specific_01.str._M_len = DAT_00e646d0;
    ABI::wasm2js::ensureHelpers(pwVar35,ABI::wasm2js::TRAP,specific_01);
    name_01.str._M_str = extraout_RDX_03;
    sVar38 = DAT_00e646d0;
    pMVar36 = ABI::wasm2js::TRAP;
LAB_007603d5:
    this = _cStack_38;
    target_03.str._M_str = name_01.str._M_str;
    target_03.str._M_len = sVar38;
    IVar44.str._M_str = cashew::ValueBuilder::makeCall((ValueBuilder *)pMVar36,target_03);
    break;
  case AtomicRMWId:
    HVar42 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)(byte)curr[1].field_0x4,*(Expression **)(curr + 2),
                        (Index)curr[1].type.id);
    puVar30 = &switchD_0075fe78::switchdataD_00b77490;
    switch(curr[1]._id) {
    case InvalidId:
      name_01.str._M_str = "add";
      break;
    case BlockId:
      name_01.str._M_str = "sub";
      break;
    case IfId:
      name_01.str._M_str = "and";
      break;
    case LoopId:
      name_01.str._M_str = "or";
      break;
    case BreakId:
      name_01.str._M_str = "xor";
      break;
    case SwitchId:
      name_01.str._M_str = "exchange";
      break;
    default:
      handle_unreachable("unimp",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x844);
    }
    IString::IString((IString *)&old.str._M_str,name_01.str._M_str);
    key_01.str._M_len._4_4_ = targetIndexes._M_t._M_impl._4_4_;
    key_01.str._M_len._0_4_ = targetIndexes._M_t._M_impl._0_4_;
    name_08.str._M_str = extraout_RDX_04;
    name_08.str._M_len = DAT_00e64c80;
    IVar44.str._M_str = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_08);
    key_01.str._M_str = (char *)puVar30;
    IVar44.str._M_str = cashew::ValueBuilder::makeDot(IVar44.str._M_str,(Ref)old.str._M_str,key_01);
    IVar44.str._M_str = cashew::ValueBuilder::makeCall(IVar44.str._M_str);
    cashew::ValueBuilder::appendToCall(IVar44.str._M_str,HVar42.heap.inst);
    cashew::ValueBuilder::appendToCall(IVar44.str._M_str,HVar42.ptr.inst);
    nextResult_23.str._M_str = (char *)DAT_00e645f0;
    nextResult_23.str._M_len = EXPRESSION_RESULT;
    RVar23 = IString_(this,(Expression *)curr[2].type.id,nextResult_23);
    goto LAB_00760968;
  case AtomicCmpxchgId:
    HVar42 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)(byte)(char)curr[1]._id,*(Expression **)(curr + 2),
                        (Index)curr[1].type.id);
    nextResult_06.str._M_str = (char *)DAT_00e645f0;
    nextResult_06.str._M_len = EXPRESSION_RESULT;
    RVar23 = IString_(_cStack_38,(Expression *)curr[2].type.id,nextResult_06);
    this = _cStack_38;
    nextResult_07.str._M_str = (char *)DAT_00e645f0;
    nextResult_07.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(_cStack_38,*(Expression **)(curr + 3),nextResult_07);
    name_03.str._M_str = extraout_RDX_02;
    name_03.str._M_len = DAT_00e64c80;
    IVar44.str._M_str = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_03);
    key_00.str._M_str = (char *)&cashew::COMPARE_EXCHANGE;
    key_00.str._M_len = DAT_00e64c90;
    IVar44.str._M_str =
         cashew::ValueBuilder::makeDot(IVar44.str._M_str,cashew::COMPARE_EXCHANGE,key_00);
    IVar44.str._M_str = cashew::ValueBuilder::makeCall(IVar44.str._M_str);
    RStack_50 = HVar42.heap.inst;
    cashew::ValueBuilder::appendToCall(IVar44.str._M_str,RStack_50);
    local_48 = HVar42.ptr.inst;
    cashew::ValueBuilder::appendToCall(IVar44.str._M_str,local_48);
    cashew::ValueBuilder::appendToCall(IVar44.str._M_str,RVar23);
    cashew::ValueBuilder::appendToCall(IVar44.str._M_str,RVar24);
    TVar37.id = (curr->type).id;
    goto LAB_0075fe32;
  case AtomicWaitId:
  case SIMDExtractId:
  case SIMDReplaceId:
  case SIMDShuffleId:
  case SIMDTernaryId:
  case SIMDShiftId:
  case SIMDLoadId:
  case SIMDLoadStoreLaneId:
  case PopId:
  case RefNullId:
  case RefIsNullId:
  case RefFuncId:
  case RefEqId:
  case TableGetId:
  case TableSetId:
  case TableSizeId:
  case TableGrowId:
  case TryId:
  case ThrowId:
  case RethrowId:
  case TupleMakeId:
  case TupleExtractId:
  case I31NewId:
  case I31GetId:
  case CallRefId:
  case RefTestId:
  case RefCastId:
  case BrOnId:
  case StructNewId:
  case StructGetId:
  case StructSetId:
  case ArrayNewId:
  case ArrayNewSegId:
  case ArrayNewFixedId:
  case ArrayGetId:
  case ArraySetId:
  case ArrayLenId:
  case ArrayCopyId:
  case ArrayFillId:
  case ArrayInitId:
  case RefAsId:
  case StringNewId:
  case StringConstId:
  case StringMeasureId:
  case StringEncodeId:
  case StringConcatId:
  case StringEqId:
  case StringAsId:
  case StringWTF8AdvanceId:
  case StringWTF16GetId:
  case StringIterNextId:
  case StringIterMoveId:
  case StringSliceWTFId:
  case StringSliceIterId:
    unimplemented(wasm::Expression__(curr,(Expression *)&switchD_0075f9eb::switchdataD_00b770c0);
    goto LAB_00761218;
  case AtomicNotifyId:
    name_01.str._M_len = DAT_00e64c80;
    RVar23 = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_01);
    IString::IString((IString *)&old.str._M_str,"notify");
    key.str._M_len._4_4_ = targetIndexes._M_t._M_impl._4_4_;
    key.str._M_len._0_4_ = targetIndexes._M_t._M_impl._0_4_;
    key.str._M_str = (char *)IVar44.str._M_str;
    IVar44.str._M_str = cashew::ValueBuilder::makeDot(RVar23.inst,(Ref)old.str._M_str,key);
    IVar44.str._M_str = cashew::ValueBuilder::makeCall(IVar44.str._M_str);
    name_02.str._M_str = extraout_RDX;
    name_02.str._M_len = DAT_00e64af0;
    RVar23 = cashew::ValueBuilder::makeName(cashew::HEAP32,name_02);
    cashew::ValueBuilder::appendToCall(IVar44.str._M_str,RVar23);
    RVar23 = makePointer(wasm::Expression*,wasm::Address_
                       (this,(Expression *)curr[1].type.id,(Address)*(address64_t *)(curr + 1));
    RVar23 = cashew::ValueBuilder::makePtrShift(RVar23,2);
    cashew::ValueBuilder::appendToCall(IVar44.str._M_str,RVar23);
    nextResult_04.str._M_str = (char *)DAT_00e645f0;
    nextResult_04.str._M_len = EXPRESSION_RESULT;
    RVar23 = IString_(this,*(Expression **)(curr + 2),nextResult_04);
    RVar23 = makeSigning(RVar23,JS_UNSIGNED);
LAB_00760968:
    cashew::ValueBuilder::appendToCall(IVar44.str._M_str,RVar23);
    break;
  case MemoryInitId:
    IVar44.str._M_len = DAT_00e64660;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::MEMORY_INIT,IVar44);
    sVar38 = DAT_00e64660;
    pMVar36 = ABI::wasm2js::MEMORY_INIT;
    IVar16 = getDataIndex((Wasm2JSBuilder *)_cStack_38->inst,(Name)curr[1]);
    IVar44.str._M_str = cashew::ValueBuilder::makeDouble((double)IVar16);
    nextResult_00.str._M_str = (char *)DAT_00e645f0;
    nextResult_00.str._M_len = EXPRESSION_RESULT;
    RVar23 = IString_(_cStack_38,*(Expression **)(curr + 2),nextResult_00);
    nextResult_01.str._M_str = (char *)DAT_00e645f0;
    nextResult_01.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(_cStack_38,(Expression *)curr[2].type.id,nextResult_01);
    this = _cStack_38;
    nextResult_02.str._M_str = (char *)DAT_00e645f0;
    nextResult_02.str._M_len = EXPRESSION_RESULT;
    args_2 = IString_(_cStack_38,*(Expression **)(curr + 3),nextResult_02);
    target.str._M_str = (char *)IVar44.str._M_str;
    target.str._M_len = sVar38;
    IVar44.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref,cashew::Ref>
                   ((ValueBuilder *)pMVar36,target,RVar23,RVar24,args_2,args_3);
    break;
  case DataDropId:
    specific.str._M_str = (char *)IVar44.str._M_str;
    specific.str._M_len = DAT_00e64690;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::DATA_DROP,specific);
    this = _cStack_38;
    sVar38 = DAT_00e64690;
    pMVar36 = ABI::wasm2js::DATA_DROP;
    IVar16 = getDataIndex((Wasm2JSBuilder *)_cStack_38->inst,(Name)curr[1]);
    RVar23 = cashew::ValueBuilder::makeDouble((double)IVar16);
LAB_00760138:
    target_00.str._M_str = (char *)RVar23.inst;
    target_00.str._M_len = sVar38;
    IVar44.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref>
                   ((ValueBuilder *)pMVar36,target_00,IVar44.str._M_str);
    break;
  case MemoryCopyId:
    pwVar35 = *(wasm2js **)((long)this + 0x20);
    puVar31 = &ABI::wasm2js::MEMORY_COPY;
    goto LAB_0076025f;
  case MemoryFillId:
    pwVar35 = *(wasm2js **)((long)this + 0x20);
    puVar31 = &ABI::wasm2js::MEMORY_FILL;
LAB_0076025f:
    specific_00.str._M_str = (char *)IVar44.str._M_str;
    specific_00.str._M_len = puVar31[1];
    ABI::wasm2js::ensureHelpers(pwVar35,(Module *)*puVar31,specific_00);
    pVVar7 = (ValueBuilder *)*puVar31;
    sVar38 = puVar31[1];
    nextResult_16.str._M_str = (char *)DAT_00e645f0;
    nextResult_16.str._M_len = EXPRESSION_RESULT;
    IVar44.str._M_str = IString_(_cStack_38,*(Expression **)(curr + 1),nextResult_16);
    nextResult_17.str._M_str = (char *)DAT_00e645f0;
    nextResult_17.str._M_len = EXPRESSION_RESULT;
    RVar23 = IString_(_cStack_38,(Expression *)curr[1].type.id,nextResult_17);
    this = _cStack_38;
    nextResult_18.str._M_str = (char *)DAT_00e645f0;
    nextResult_18.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(_cStack_38,*(Expression **)(curr + 2),nextResult_18);
    target_02.str._M_str = (char *)IVar44.str._M_str;
    target_02.str._M_len = sVar38;
    IVar44.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref>
                   (pVVar7,target_02,RVar23,RVar24,in_R9);
    break;
  default:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                       ,0x45);
  }
LAB_00760dd9:
  ((Ref *)((long)this + 8))->inst = args_3.inst;
  ((Ref *)((long)this + 0x10))->inst = (Value *)old.str._M_len;
  return (Ref)IVar44.str._M_str;
}

Assistant:

Ref visit(Expression* curr, IString nextResult) {
      IString old = result;
      result = nextResult;
      Ref ret = OverriddenVisitor::visit(curr);
      // keep it consistent for the rest of this frame, which may call visit on
      // multiple children
      result = old;
      return ret;
    }